

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  uint uVar1;
  uint uVar2;
  Node *block;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  TValue *pTVar7;
  int *piVar8;
  TValue *pTVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  
  uVar1 = t->sizearray;
  uVar15 = (ulong)uVar1;
  if (t->lastfree == (Node *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (uVar1 < nasize) {
    pTVar7 = (TValue *)luaM_realloc_(L,t->array,uVar15 << 4,(ulong)nasize << 4);
    t->array = pTVar7;
    auVar6 = _DAT_00124080;
    auVar5 = _DAT_00124070;
    auVar4 = _DAT_00124060;
    uVar2 = t->sizearray;
    if (uVar2 < nasize) {
      lVar12 = (ulong)nasize - (ulong)uVar2;
      lVar13 = lVar12 + -1;
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      piVar8 = &pTVar7[(ulong)uVar2 + 3].tt_;
      uVar10 = 0;
      auVar16 = auVar16 ^ _DAT_00124080;
      do {
        auVar18._8_4_ = (int)uVar10;
        auVar18._0_8_ = uVar10;
        auVar18._12_4_ = (int)(uVar10 >> 0x20);
        auVar19 = (auVar18 | auVar5) ^ auVar6;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar19._4_4_ == iVar17 && auVar16._0_4_ < auVar19._0_4_ ||
                    iVar17 < auVar19._4_4_) & 1)) {
          piVar8[-0xc] = 0;
        }
        if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
            auVar19._12_4_ <= auVar16._12_4_) {
          piVar8[-8] = 0;
        }
        auVar18 = (auVar18 | auVar4) ^ auVar6;
        iVar20 = auVar18._4_4_;
        if (iVar20 <= iVar17 && (iVar20 != iVar17 || auVar18._0_4_ <= auVar16._0_4_)) {
          piVar8[-4] = 0;
          *piVar8 = 0;
        }
        uVar10 = uVar10 + 4;
        piVar8 = piVar8 + 0x10;
      } while ((lVar12 + 3U & 0xfffffffffffffffc) != uVar10);
    }
    t->sizearray = nasize;
  }
  setnodevector(L,t,nhsize);
  if (nasize < uVar1) {
    t->sizearray = nasize;
    uVar14 = (ulong)nasize;
    lVar12 = uVar14 << 4;
    uVar10 = uVar14;
    do {
      uVar10 = uVar10 + 1;
      if (*(int *)((long)&t->array->tt_ + lVar12) != 0) {
        luaH_setint(L,t,uVar10,(TValue *)((long)&t->array->value_ + lVar12));
      }
      lVar12 = lVar12 + 0x10;
    } while (uVar10 != uVar15);
    pTVar7 = (TValue *)luaM_realloc_(L,t->array,uVar15 << 4,uVar14 << 4);
    t->array = pTVar7;
  }
  if (0 < (int)uVar11) {
    uVar10 = (ulong)uVar11;
    uVar15 = uVar10 + 1;
    pTVar7 = (TValue *)&block[uVar10 - 1].i_key;
    do {
      if (pTVar7[-1].tt_ != 0) {
        pTVar9 = luaH_set(L,t,pTVar7);
        iVar17 = pTVar7[-1].tt_;
        uVar3 = *(undefined4 *)&pTVar7[-1].field_0xc;
        pTVar9->value_ = pTVar7[-1].value_;
        pTVar9->tt_ = iVar17;
        *(undefined4 *)&pTVar9->field_0xc = uVar3;
      }
      uVar15 = uVar15 - 1;
      pTVar7 = pTVar7 + -2;
    } while (1 < uVar15);
    if (0 < (int)uVar11) {
      luaM_realloc_(L,block,uVar10 << 5,0);
      return;
    }
  }
  return;
}

Assistant:

void luaH_resize(lua_State *L, Table *t, unsigned int nasize,
                 unsigned int nhsize) {
    unsigned int i;
    int j;
    unsigned int oldasize = t->sizearray;
    int oldhsize = allocsizenode(t);
    Node *nold = t->node;  /* save old hash ... */
    if (nasize > oldasize)  /* array part must grow? */
        setarrayvector(L, t, nasize);
    /* create new hash part with appropriate size */
    setnodevector(L, t, nhsize);
    if (nasize < oldasize) {  /* array part must shrink? */
        t->sizearray = nasize;
        /* re-insert elements from vanishing slice */
        for (i = nasize; i < oldasize; i++) {
            if (!ttisnil(&t->array[i]))
                luaH_setint(L, t, i + 1, &t->array[i]);
        }
        /* shrink array */
        luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
    }
    /* re-insert elements from hash part */
    for (j = oldhsize - 1; j >= 0; j--) {
        Node *old = nold + j;
        if (!ttisnil(gval(old))) {
            /* doesn't need barrier/invalidate cache, as entry was
               already present in the table */
            setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
        }
    }
    if (oldhsize > 0)  /* not the dummy node? */
        luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}